

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::anon_unknown_0::atot<double>(anon_unknown_0 *this,char *s,Parser *parser,double *val)

{
  double *msg;
  Parser *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_29;
  double *pdStack_28;
  bool done;
  double *val_local;
  Parser *parser_local;
  char *s_local;
  
  pdStack_28 = val;
  val_local = (double *)parser;
  parser_local = (Parser *)s;
  s_local = (char *)this;
  local_29 = atot_scalar<double>(s,val);
  __s = parser_local;
  msg = val_local;
  if ((bool)local_29) {
    NoError();
  }
  else if ((*pdStack_28 != 0.0) || (NAN(*pdStack_28))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,(char *)__s,&local_149);
    std::operator+(&local_128,"invalid number: \"",&local_148);
    std::operator+(&local_108,&local_128,"\"");
    std::operator+(&local_e8,&local_108,", constant does not fit ");
    TypeToIntervalString<double>();
    std::operator+(&local_c8,&local_e8,&local_170);
    Parser::Error((Parser *)this,(string *)msg);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,(char *)__s,&local_91);
    std::operator+(&local_70,"invalid number: \"",&local_90);
    std::operator+(&local_50,&local_70,"\"");
    Parser::Error((Parser *)this,(string *)msg);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  return SUB82(this,0);
}

Assistant:

static CheckedError atot(const char *s, Parser &parser, T *val) {
  auto done = atot_scalar(s, val, bool_constant<is_floating_point<T>::value>());
  if (done) return NoError();
  if (0 == *val)
    return parser.Error("invalid number: \"" + std::string(s) + "\"");
  else
    return parser.Error("invalid number: \"" + std::string(s) + "\"" +
                        ", constant does not fit " + TypeToIntervalString<T>());
}